

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.h
# Opt level: O0

string * trun::Config::ModuleExecutionTypeToStr_abi_cxx11_(ModuleExecutionType type)

{
  initializer_list<std::pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  bool bVar1;
  int iVar2;
  pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c0;
  _Node_iterator_base<std::pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_b0;
  _Node_iterator_base<std::pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_a8;
  allocator<char> local_9c;
  allocator<std::pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9b;
  key_equal local_9a;
  hasher local_99;
  ModuleExecutionType local_98 [5];
  ModuleExecutionType local_84;
  pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_80;
  pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  iterator local_28;
  _Alloc_hider local_20;
  ModuleExecutionType local_14;
  string *psStack_10;
  ModuleExecutionType type_local;
  
  local_14 = type;
  if (ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::type2str_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::
                                 type2str_abi_cxx11_);
    if (iVar2 != 0) {
      local_80 = &local_78;
      local_84 = kSequential;
      std::
      pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<trun::ModuleExecutionType,_const_char_(&)[11],_true>
                (local_80,&local_84,(char (*) [11])"Sequential");
      local_80 = &local_50;
      local_98[0] = kParallel;
      std::
      pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<trun::ModuleExecutionType,_const_char_(&)[9],_true>
                (local_80,local_98,(char (*) [9])"Parallel");
      local_28 = &local_78;
      local_20._M_p = (pointer)0x2;
      std::
      allocator<std::pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::allocator(&local_9b);
      __l._M_len = (size_type)local_20._M_p;
      __l._M_array = local_28;
      std::
      unordered_map<trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<trun::ModuleExecutionType>,_std::equal_to<trun::ModuleExecutionType>,_std::allocator<std::pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::unordered_map(&ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::
                       type2str_abi_cxx11_,__l,0,&local_99,&local_9a,&local_9b);
      std::
      allocator<std::pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~allocator(&local_9b);
      local_c0 = (pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28;
      do {
        local_c0 = local_c0 + -1;
        std::
        pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(local_c0);
      } while (local_c0 != &local_78);
      __cxa_atexit(std::
                   unordered_map<trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<trun::ModuleExecutionType>,_std::equal_to<trun::ModuleExecutionType>,_std::allocator<std::pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~unordered_map,
                   &ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::
                    type2str_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::
                           type2str_abi_cxx11_);
    }
  }
  if (ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::unknown_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::
                                 unknown_abi_cxx11_);
    if (iVar2 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::unknown_abi_cxx11_
                 ,"unknown",&local_9c);
      std::allocator<char>::~allocator(&local_9c);
      __cxa_atexit(std::__cxx11::string::~string,
                   &ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::
                    unknown_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::
                           unknown_abi_cxx11_);
    }
  }
  local_a8._M_cur =
       (__node_type *)
       std::
       unordered_map<trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<trun::ModuleExecutionType>,_std::equal_to<trun::ModuleExecutionType>,_std::allocator<std::pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::type2str_abi_cxx11_,
              &local_14);
  local_b0._M_cur =
       (__node_type *)
       std::
       unordered_map<trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<trun::ModuleExecutionType>,_std::equal_to<trun::ModuleExecutionType>,_std::allocator<std::pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::type2str_abi_cxx11_);
  bVar1 = std::__detail::operator==(&local_a8,&local_b0);
  if (bVar1) {
    psStack_10 = &ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::unknown_abi_cxx11_
    ;
  }
  else {
    psStack_10 = std::
                 unordered_map<trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<trun::ModuleExecutionType>,_std::equal_to<trun::ModuleExecutionType>,_std::allocator<std::pair<const_trun::ModuleExecutionType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&ModuleExecutionTypeToStr[abi:cxx11](trun::ModuleExecutionType)::
                               type2str_abi_cxx11_,&local_14);
  }
  return psStack_10;
}

Assistant:

static const std::string &ModuleExecutionTypeToStr(ModuleExecutionType type) {
            static std::unordered_map<ModuleExecutionType, std::string> type2str = {
                    {ModuleExecutionType::kSequential, "Sequential"},
                    {ModuleExecutionType::kParallel, "Parallel"},
            };
            static std::string unknown = "unknown";
            if (type2str.find(type) == type2str.end()) {
                return unknown;
            }
            return type2str[type];
        }